

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void arm_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  uc_struct_conflict7 *puVar1;
  TCGContext_conflict6 *tcg_ctx_00;
  CPUArchState_conflict1 *env_00;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  DisasJumpType DVar5;
  uint32_t uVar6;
  ArchCPU_conflict1 *pAVar7;
  TCGv_i64 pTVar8;
  undefined4 uVar9;
  int local_68;
  _Bool local_62;
  byte local_61;
  int bound;
  uint32_t core_mmu_idx;
  uint32_t condexec;
  uint32_t tb_flags;
  ARMCPU_conflict *cpu;
  CPUARMState_conflict *env;
  TCGContext_conflict1 *tcg_ctx;
  uc_struct_conflict2 *uc;
  DisasContextBase *__mptr;
  DisasContext_conflict1 *dc;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  puVar1 = cs->uc;
  tcg_ctx_00 = cs->uc->tcg_ctx;
  env_00 = (CPUArchState_conflict1 *)cs->env_ptr;
  pAVar7 = env_archcpu(env_00);
  uVar6 = dcbase->tb->flags;
  dcbase[8].pc_next = (target_ulong)puVar1;
  dcbase[1].tb = (TranslationBlock *)&pAVar7->isar;
  dcbase[1].num_insns = 0;
  dcbase[3].num_insns = 0;
  iVar3 = arm_feature(env_00,0x21);
  local_61 = 0;
  if (iVar3 != 0) {
    _Var2 = arm_el_is_aa64(env_00,3);
    local_61 = _Var2 ^ 0xff;
  }
  *(byte *)((long)&dcbase[3].tb + 4) = local_61 & 1;
  uVar4 = extract32(uVar6,8,1);
  *(uint32_t *)&dcbase[2].pc_first = uVar4;
  uVar4 = extract32(uVar6,0x1c,1);
  uVar9 = 0;
  if (uVar4 != 0) {
    uVar9 = 8;
  }
  *(undefined4 *)&dcbase[2].pc_next = uVar9;
  uVar4 = extract32(uVar6,0,8);
  *(uint32_t *)&dcbase[2].tb = (uVar4 & 0xf) << 1;
  *(uint32_t *)((long)&dcbase[2].tb + 4) = uVar4 >> 4;
  uVar4 = extract32(uVar6,0x18,4);
  DVar5 = core_to_arm_mmu_idx(env_00,uVar4);
  dcbase[2].is_jmp = DVar5;
  iVar3 = arm_mmu_idx_to_el_aarch64(dcbase[2].is_jmp);
  dcbase[3].max_insns = iVar3;
  *(uint *)((long)&dcbase[2].pc_next + 4) = (uint)(dcbase[3].max_insns == 0);
  uVar4 = extract32(uVar6,0x16,2);
  dcbase[2].max_insns = uVar4;
  iVar3 = arm_feature(env_00,9);
  if (iVar3 == 0) {
    uVar4 = extract32(uVar6,0x1c,1);
    uVar9 = 0;
    if (uVar4 != 0) {
      uVar9 = 8;
    }
    *(undefined4 *)&dcbase[2].pc_next = uVar9;
    uVar4 = extract32(uVar6,0x14,2);
    *(uint32_t *)&dcbase[3].singlestep_enabled = uVar4;
    uVar4 = extract32(uVar6,0xf,1);
    *(uint32_t *)((long)&dcbase[2].pc_first + 4) = uVar4;
    uVar4 = extract32(uVar6,0x10,1);
    *(bool *)((long)&dcbase[4].pc_next + 7) = uVar4 != 0;
    uVar4 = extract32(uVar6,0x11,1);
    *(bool *)((long)&dcbase[2].num_insns + 2) = uVar4 != 0;
    uVar4 = extract32(uVar6,0xe,1);
    *(bool *)((long)&dcbase[3].tb + 5) = uVar4 != 0;
    iVar3 = arm_feature(env_00,1);
    if (iVar3 == 0) {
      uVar4 = extract32(uVar6,9,3);
      *(uint32_t *)&dcbase[3].pc_first = uVar4;
      uVar4 = extract32(uVar6,0xc,2);
      *(uint32_t *)((long)&dcbase[3].pc_first + 4) = uVar4;
    }
    else {
      uVar4 = extract32(uVar6,0xc,2);
      dcbase[4].num_insns = uVar4;
    }
  }
  else {
    *(undefined1 *)((long)&dcbase[3].tb + 5) = 1;
    *(undefined4 *)&dcbase[2].pc_next = 0;
    uVar4 = extract32(uVar6,9,1);
    *(bool *)&dcbase[3].pc_next = uVar4 != 0;
    iVar3 = arm_feature(env_00,0x25);
    local_62 = false;
    if (iVar3 != 0) {
      local_62 = regime_is_secure(env_00,dcbase[2].is_jmp);
    }
    *(_Bool *)((long)&dcbase[3].pc_next + 1) = local_62;
    uVar4 = extract32(uVar6,10,1);
    *(bool *)((long)&dcbase[3].pc_next + 2) = uVar4 != 0;
    uVar4 = extract32(uVar6,0xd,1);
    *(bool *)((long)&dcbase[3].pc_next + 3) = uVar4 != 0;
    uVar4 = extract32(uVar6,0xc,1);
    *(bool *)((long)&dcbase[3].pc_next + 4) = uVar4 != 0;
    uVar4 = extract32(uVar6,0xb,1);
    *(bool *)((long)&dcbase[3].pc_next + 5) = uVar4 != 0;
  }
  dcbase[4].tb = (TranslationBlock *)pAVar7->cp_regs;
  dcbase[4].pc_first = env_00->features;
  uVar4 = extract32(uVar6,0x1e,1);
  *(bool *)((long)&dcbase[4].pc_next + 1) = uVar4 != 0;
  uVar6 = extract32(uVar6,0x1d,1);
  *(bool *)((long)&dcbase[4].pc_next + 2) = uVar6 != 0;
  *(undefined1 *)((long)&dcbase[4].pc_next + 3) = 0;
  dcbase[1].pc_next = dcbase->pc_first & *(ulong *)&puVar1->init_target_page->mask;
  _Var2 = is_singlestepping((DisasContext_conflict1 *)dcbase);
  if (_Var2) {
    dcbase->max_insns = 1;
  }
  if ((int)dcbase[2].pc_first == 0) {
    local_68 = (int)(-(dcbase->pc_first | *(ulong *)&puVar1->init_target_page->mask) >> 2);
    if (dcbase->max_insns < local_68) {
      local_68 = dcbase->max_insns;
    }
    dcbase->max_insns = local_68;
  }
  pTVar8 = tcg_temp_new_i64((TCGContext_conflict1 *)tcg_ctx_00);
  tcg_ctx_00->cpu_V0 = pTVar8;
  pTVar8 = tcg_temp_new_i64((TCGContext_conflict1 *)tcg_ctx_00);
  tcg_ctx_00->cpu_V1 = pTVar8;
  pTVar8 = tcg_temp_new_i64((TCGContext_conflict1 *)tcg_ctx_00);
  tcg_ctx_00->cpu_M0 = pTVar8;
  return;
}

Assistant:

static void arm_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;
    TCGContext *tcg_ctx = cs->uc->tcg_ctx;
    CPUARMState *env = cs->env_ptr;
    ARMCPU *cpu = env_archcpu(env);
    uint32_t tb_flags = dc->base.tb->flags;
    uint32_t condexec, core_mmu_idx;

    // unicorn handle
    dc->uc = uc;
    dc->isar = &cpu->isar;
    dc->condjmp = 0;

    dc->aarch64 = 0;
    /* If we are coming from secure EL0 in a system with a 32-bit EL3, then
     * there is no secure EL1, so we route exceptions to EL3.
     */
    dc->secure_routed_to_el3 = arm_feature(env, ARM_FEATURE_EL3) &&
                               !arm_el_is_aa64(env, 3);
    dc->thumb = FIELD_EX32(tb_flags, TBFLAG_AM32, THUMB);
    dc->be_data = FIELD_EX32(tb_flags, TBFLAG_ANY, BE_DATA) ? MO_BE : MO_LE;
    condexec = FIELD_EX32(tb_flags, TBFLAG_AM32, CONDEXEC);
    dc->condexec_mask = (condexec & 0xf) << 1;
    dc->condexec_cond = condexec >> 4;

    core_mmu_idx = FIELD_EX32(tb_flags, TBFLAG_ANY, MMUIDX);
    dc->mmu_idx = core_to_arm_mmu_idx(env, core_mmu_idx);
    dc->current_el = arm_mmu_idx_to_el(dc->mmu_idx);
    dc->user = (dc->current_el == 0);
    dc->fp_excp_el = FIELD_EX32(tb_flags, TBFLAG_ANY, FPEXC_EL);

    if (arm_feature(env, ARM_FEATURE_M)) {
        dc->vfp_enabled = 1;
        dc->be_data = MO_TE;
        dc->v7m_handler_mode = FIELD_EX32(tb_flags, TBFLAG_M32, HANDLER);
        dc->v8m_secure = arm_feature(env, ARM_FEATURE_M_SECURITY) &&
            regime_is_secure(env, dc->mmu_idx);
        dc->v8m_stackcheck = FIELD_EX32(tb_flags, TBFLAG_M32, STACKCHECK);
        dc->v8m_fpccr_s_wrong =
            FIELD_EX32(tb_flags, TBFLAG_M32, FPCCR_S_WRONG);
        dc->v7m_new_fp_ctxt_needed =
            FIELD_EX32(tb_flags, TBFLAG_M32, NEW_FP_CTXT_NEEDED);
        dc->v7m_lspact = FIELD_EX32(tb_flags, TBFLAG_M32, LSPACT);
    } else {
        dc->be_data =
            FIELD_EX32(tb_flags, TBFLAG_ANY, BE_DATA) ? MO_BE : MO_LE;
        dc->debug_target_el =
            FIELD_EX32(tb_flags, TBFLAG_ANY, DEBUG_TARGET_EL);
        dc->sctlr_b = FIELD_EX32(tb_flags, TBFLAG_A32, SCTLR_B);
        dc->hstr_active = FIELD_EX32(tb_flags, TBFLAG_A32, HSTR_ACTIVE);
        dc->ns = FIELD_EX32(tb_flags, TBFLAG_A32, NS);
        dc->vfp_enabled = FIELD_EX32(tb_flags, TBFLAG_A32, VFPEN);
        if (arm_feature(env, ARM_FEATURE_XSCALE)) {
            dc->c15_cpar = FIELD_EX32(tb_flags, TBFLAG_A32, XSCALE_CPAR);
        } else {
            dc->vec_len = FIELD_EX32(tb_flags, TBFLAG_A32, VECLEN);
            dc->vec_stride = FIELD_EX32(tb_flags, TBFLAG_A32, VECSTRIDE);
        }
    }
    dc->cp_regs = cpu->cp_regs;
    dc->features = env->features;

    /* Single step state. The code-generation logic here is:
     *  SS_ACTIVE == 0:
     *   generate code with no special handling for single-stepping (except
     *   that anything that can make us go to SS_ACTIVE == 1 must end the TB;
     *   this happens anyway because those changes are all system register or
     *   PSTATE writes).
     *  SS_ACTIVE == 1, PSTATE.SS == 1: (active-not-pending)
     *   emit code for one insn
     *   emit code to clear PSTATE.SS
     *   emit code to generate software step exception for completed step
     *   end TB (as usual for having generated an exception)
     *  SS_ACTIVE == 1, PSTATE.SS == 0: (active-pending)
     *   emit code to generate a software step exception
     *   end the TB
     */
    dc->ss_active = FIELD_EX32(tb_flags, TBFLAG_ANY, SS_ACTIVE);
    dc->pstate_ss = FIELD_EX32(tb_flags, TBFLAG_ANY, PSTATE_SS);
    dc->is_ldex = false;

    dc->page_start = dc->base.pc_first & TARGET_PAGE_MASK;

    /* If architectural single step active, limit to 1.  */
    if (is_singlestepping(dc)) {
        dc->base.max_insns = 1;
    }

    /* ARM is a fixed-length ISA.  Bound the number of insns to execute
       to those left on the page.  */
    if (!dc->thumb) {
#ifdef _MSC_VER
        int bound = (0 - (dc->base.pc_first | TARGET_PAGE_MASK)) / 4;
#else
        int bound = -(dc->base.pc_first | TARGET_PAGE_MASK) / 4;
#endif
        dc->base.max_insns = MIN(dc->base.max_insns, bound);
    }

    tcg_ctx->cpu_V0 = tcg_temp_new_i64(tcg_ctx);
    tcg_ctx->cpu_V1 = tcg_temp_new_i64(tcg_ctx);
    /* FIXME: cpu_M0 can probably be the same as cpu_V0.  */
    tcg_ctx->cpu_M0 = tcg_temp_new_i64(tcg_ctx);
}